

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btShapeHull.cpp
# Opt level: O3

bool __thiscall btShapeHull::buildHull(btShapeHull *this,btScalar param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btConvexShape *pbVar3;
  btVector3 *ptr;
  uint *ptr_00;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  HullError HVar7;
  btVector3 *pbVar8;
  uint *puVar9;
  long lVar10;
  ulong uVar11;
  int i;
  uint uVar12;
  long lVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  HullResult hr;
  HullLibrary hl;
  btVector3 supportPoints [62];
  HullResult local_4c8;
  HullLibrary local_478;
  HullDesc local_438;
  btVector3 local_418 [62];
  
  uVar6 = (*(this->m_shape->super_btCollisionShape)._vptr_btCollisionShape[0x15])();
  if ((int)uVar6 < 1) {
    uVar12 = 0x2a;
  }
  else {
    pbVar8 = getUnitSpherePoints::sUnitSpherePoints + 0x2a;
    uVar5 = 0;
    do {
      uVar12 = uVar5;
      (*(this->m_shape->super_btCollisionShape)._vptr_btCollisionShape[0x16])
                (this->m_shape,(ulong)uVar12,local_418);
      getUnitSpherePoints();
      *(undefined8 *)pbVar8->m_floats = local_418[0].m_floats._0_8_;
      *(undefined8 *)(pbVar8->m_floats + 2) = local_418[0].m_floats._8_8_;
      pbVar8 = pbVar8 + 1;
      uVar5 = uVar12 + 1;
    } while (uVar6 != uVar12 + 1);
    uVar12 = uVar12 + 0x2b;
  }
  lVar13 = 0;
  do {
    pbVar3 = this->m_shape;
    getUnitSpherePoints();
    (*(pbVar3->super_btCollisionShape)._vptr_btCollisionShape[0x10])
              (pbVar3,(long)getUnitSpherePoints::sUnitSpherePoints[0].m_floats + lVar13);
    *(undefined4 *)((long)local_418[0].m_floats + lVar13) = extraout_XMM0_Da;
    *(undefined4 *)((long)local_418[0].m_floats + lVar13 + 4) = extraout_XMM0_Db;
    *(int *)((long)local_418[0].m_floats + lVar13 + 8) = (int)in_XMM1_Qa;
    *(int *)((long)local_418[0].m_floats + lVar13 + 0xc) = (int)((ulong)in_XMM1_Qa >> 0x20);
    lVar13 = lVar13 + 0x10;
  } while ((ulong)uVar12 << 4 != lVar13);
  local_438.mMaxVertices = 0x1000;
  local_438.mMaxFaces = 0x1000;
  local_438.mFlags = 1;
  local_438.mVertices = local_418;
  local_438.mVertexStride = 0x10;
  local_438.mNormalEpsilon = 0.001;
  local_478.m_tris.m_ownsMemory = true;
  local_478.m_tris.m_data = (btHullTriangle **)0x0;
  local_478.m_tris.m_size = 0;
  local_478.m_tris.m_capacity = 0;
  local_478.m_vertexIndexMapping.m_ownsMemory = true;
  local_478.m_vertexIndexMapping.m_data = (int *)0x0;
  local_478.m_vertexIndexMapping.m_size = 0;
  local_478.m_vertexIndexMapping.m_capacity = 0;
  local_4c8.m_OutputVertices.m_ownsMemory = true;
  local_4c8.m_OutputVertices.m_data = (btVector3 *)0x0;
  local_4c8.m_OutputVertices.m_size = 0;
  local_4c8.m_OutputVertices.m_capacity = 0;
  local_4c8.m_Indices.m_ownsMemory = true;
  local_4c8.m_Indices.m_data = (uint *)0x0;
  local_4c8.m_Indices.m_size = 0;
  local_4c8.m_Indices.m_capacity = 0;
  local_4c8.mPolygons = true;
  local_4c8.mNumOutputVertices = 0;
  local_4c8.mNumFaces = 0;
  local_4c8.mNumIndices = 0;
  local_438.mVcount = uVar12;
  HVar7 = HullLibrary::CreateConvexHull(&local_478,&local_438,&local_4c8);
  uVar6 = local_4c8.mNumOutputVertices;
  if (HVar7 == QE_FAIL) goto LAB_00169d85;
  uVar12 = (this->m_vertices).m_size;
  if (((int)uVar12 < (int)local_4c8.mNumOutputVertices) &&
     ((this->m_vertices).m_capacity < (int)local_4c8.mNumOutputVertices)) {
    if (local_4c8.mNumOutputVertices == 0) {
      pbVar8 = (btVector3 *)0x0;
    }
    else {
      pbVar8 = (btVector3 *)
               btAlignedAllocInternal((long)(int)local_4c8.mNumOutputVertices << 4,0x10);
      uVar12 = (this->m_vertices).m_size;
    }
    if (0 < (int)uVar12) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_vertices).m_data)->m_floats + lVar13);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar8->m_floats + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar13 = lVar13 + 0x10;
      } while ((ulong)uVar12 << 4 != lVar13);
    }
    ptr = (this->m_vertices).m_data;
    if ((ptr != (btVector3 *)0x0) && ((this->m_vertices).m_ownsMemory == true)) {
      btAlignedFreeInternal(ptr);
    }
    (this->m_vertices).m_ownsMemory = true;
    (this->m_vertices).m_data = pbVar8;
    (this->m_vertices).m_capacity = uVar6;
  }
  (this->m_vertices).m_size = uVar6;
  if (0 < (int)local_4c8.mNumOutputVertices) {
    lVar13 = 0;
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)(local_4c8.m_OutputVertices.m_data)->m_floats + lVar13);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)((this->m_vertices).m_data)->m_floats + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar10 < (int)local_4c8.mNumOutputVertices);
  }
  uVar5 = local_4c8.mNumIndices;
  this->m_numIndices = local_4c8.mNumIndices;
  uVar6 = (this->m_indices).m_size;
  uVar12 = local_4c8.mNumIndices;
  if ((int)uVar6 < (int)local_4c8.mNumIndices) {
    lVar13 = (long)(int)local_4c8.mNumIndices;
    if ((this->m_indices).m_capacity < (int)local_4c8.mNumIndices) {
      if (local_4c8.mNumIndices == 0) {
        puVar9 = (uint *)0x0;
        uVar12 = uVar6;
      }
      else {
        puVar9 = (uint *)btAlignedAllocInternal(lVar13 * 4,0x10);
        uVar12 = (this->m_indices).m_size;
      }
      ptr_00 = (this->m_indices).m_data;
      if ((int)uVar12 < 1) {
        if (ptr_00 != (uint *)0x0) goto LAB_00169d21;
      }
      else {
        uVar11 = 0;
        do {
          puVar9[uVar11] = ptr_00[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
LAB_00169d21:
        if ((this->m_indices).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr_00);
        }
      }
      (this->m_indices).m_ownsMemory = true;
      (this->m_indices).m_data = puVar9;
      (this->m_indices).m_capacity = uVar5;
    }
    else {
      puVar9 = (this->m_indices).m_data;
    }
    memset(puVar9 + (int)uVar6,0,(lVar13 - (int)uVar6) * 4);
    uVar12 = this->m_numIndices;
  }
  (this->m_indices).m_size = uVar5;
  if (0 < (int)uVar12) {
    puVar9 = (this->m_indices).m_data;
    lVar13 = 0;
    do {
      puVar9[lVar13] = local_4c8.m_Indices.m_data[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)this->m_numIndices);
  }
  HullLibrary::ReleaseResult(&local_478,&local_4c8);
LAB_00169d85:
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray(&local_4c8.m_Indices);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_4c8.m_OutputVertices);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_478.m_vertexIndexMapping);
  btAlignedObjectArray<btHullTriangle_*>::~btAlignedObjectArray(&local_478.m_tris);
  return HVar7 != QE_FAIL;
}

Assistant:

bool
btShapeHull::buildHull (btScalar /*margin*/)
{
	int numSampleDirections = NUM_UNITSPHERE_POINTS;
	{
		int numPDA = m_shape->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				m_shape->getPreferredPenetrationDirection(i,norm);
				getUnitSpherePoints()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}

	btVector3 supportPoints[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	int i;
	for (i = 0; i < numSampleDirections; i++)
	{
		supportPoints[i] = m_shape->localGetSupportingVertex(getUnitSpherePoints()[i]);
	}

	HullDesc hd;
	hd.mFlags = QF_TRIANGLES;
	hd.mVcount = static_cast<unsigned int>(numSampleDirections);

#ifdef BT_USE_DOUBLE_PRECISION
	hd.mVertices = &supportPoints[0];
	hd.mVertexStride = sizeof(btVector3);
#else
	hd.mVertices = &supportPoints[0];
	hd.mVertexStride = sizeof (btVector3);
#endif

	HullLibrary hl;
	HullResult hr;
	if (hl.CreateConvexHull (hd, hr) == QE_FAIL)
	{
		return false;
	}

	m_vertices.resize (static_cast<int>(hr.mNumOutputVertices));


	for (i = 0; i < static_cast<int>(hr.mNumOutputVertices); i++)
	{
		m_vertices[i] = hr.m_OutputVertices[i];
	}
	m_numIndices = hr.mNumIndices;
	m_indices.resize(static_cast<int>(m_numIndices));
	for (i = 0; i < static_cast<int>(m_numIndices); i++)
	{
		m_indices[i] = hr.m_Indices[i];
	}

	// free temporary hull result that we just copied
	hl.ReleaseResult (hr);

	return true;
}